

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O3

void __thiscall QRegularExpression::setPattern(QRegularExpression *this,QString *pattern)

{
  long lVar1;
  bool bVar2;
  QRegularExpressionPrivate *pQVar3;
  QStringView rhs;
  QStringView lhs;
  
  pQVar3 = (this->d).d.ptr;
  lVar1 = (pQVar3->pattern).d.size;
  if (lVar1 == (pattern->d).size) {
    rhs.m_data = (pattern->d).ptr;
    rhs.m_size = lVar1;
    lhs.m_data = (pQVar3->pattern).d.ptr;
    lhs.m_size = lVar1;
    bVar2 = QtPrivate::equalStrings(lhs,rhs);
    if (bVar2) {
      return;
    }
  }
  if ((__atomic_base<int>)
      *(__int_type_conflict *)
       &(pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value != (__atomic_base<int>)0x1) {
    QExplicitlySharedDataPointer<QRegularExpressionPrivate>::detach_helper(&this->d);
    pQVar3 = (this->d).d.ptr;
  }
  pQVar3->isDirty = true;
  QString::operator=(&pQVar3->pattern,pattern);
  return;
}

Assistant:

void QRegularExpression::setPattern(const QString &pattern)
{
    if (d->pattern == pattern)
        return;
    d.detach();
    d->isDirty = true;
    d->pattern = pattern;
}